

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall
c4::yml::Parser::_filter_nl<true,true>
          (Parser *this,substr r,size_t *i,size_t *pos,size_t indentation)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  bool bVar4;
  undefined1 uVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  anon_unknown_0 aVar10;
  size_t *indentation_00;
  csubstr r_00;
  ro_substr chars;
  size_t ii;
  basic_substring<char> local_b8;
  char *local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  undefined5 local_98;
  undefined3 uStack_93;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined4 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_b8.len = r.len;
  local_b8.str = r.str;
  pcVar8 = (char *)*i;
  if (local_b8.len <= pcVar8) {
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        uVar5 = (*pcVar1)();
        return (bool)uVar5;
      }
    }
    handle_error(0x1ff947,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  aVar10 = ((anon_unknown_0 *)local_b8.str)[(long)pcVar8];
  indentation_00 = pos;
  if (indentation == 0xffffffffffffffff) {
    local_98 = 0x746e65646e;
    uStack_93 = 0x697461;
    uStack_90 = 0x3d21206e6f;
    uStack_8b = 0x706e20;
    local_a8 = (char *)0x6166206b63656863;
    uStack_a0 = 0x3a64656c69;
    uStack_9b = 0x692820;
    local_88 = 0x29736f;
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        uVar5 = (*pcVar1)();
        return (bool)uVar5;
      }
    }
    local_58 = 0;
    uStack_50 = 0x7bae;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7bae) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x7bae) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x24,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  if (aVar10 != (anon_unknown_0)0xa) {
    local_98 = 0x3d20727275;
    uStack_93 = 0x27203d;
    uStack_90 = 0x29276e5c;
    local_a8 = (char *)0x6166206b63656863;
    uStack_a0 = 0x3a64656c69;
    uStack_9b = 0x632820;
    if ((s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        uVar5 = (*pcVar1)();
        return (bool)uVar5;
      }
    }
    local_80 = 0;
    uStack_78 = 0x7baf;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7baf) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7baf) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x1d,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  r_00.len = (size_t)&local_a8;
  r_00.str = (char *)local_b8.len;
  local_a8 = pcVar8;
  sVar6 = anon_unknown_0::count_following_newlines
                    ((anon_unknown_0 *)local_b8.str,r_00,(size_t *)indentation,
                     (size_t)indentation_00);
  if (sVar6 == 0) {
    chars.len = 2;
    chars.str = " \t";
    basic_substring<char>::first_not_of(&local_b8,chars,(size_t)(pcVar8 + 1));
    pcVar8 = (this->m_filter_arena).str;
    sVar7 = *pos;
    *pos = sVar7 + 1;
    pcVar8[sVar7] = ' ';
    if ((local_a8 < local_b8.len) &&
       (*(anon_unknown_0 *)(local_b8.str + (long)local_a8) == (anon_unknown_0)0x5c)) {
      pcVar8 = local_a8 + 1;
      aVar10 = (anon_unknown_0)0x0;
      if (pcVar8 < local_b8.len) {
        aVar10 = *(anon_unknown_0 *)(local_b8.str + (long)pcVar8);
      }
      if ((aVar10 == (anon_unknown_0)0x20) || (aVar10 == (anon_unknown_0)0x9)) {
        local_a8 = pcVar8;
      }
    }
  }
  else {
    sVar7 = *pos;
    sVar9 = sVar6;
    do {
      (this->m_filter_arena).str[sVar7] = '\n';
      sVar7 = sVar7 + 1;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
    *pos = sVar7;
  }
  *i = (size_t)(local_a8 + -1);
  return sVar6 == 0;
}

Assistant:

bool Parser::_filter_nl(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfnl(fmt, ...) _c4dbgpf("filter_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfnl(...)
    #endif

    const char curr = r[*i];
    bool replaced = false;

    _RYML_CB_ASSERT(m_stack.m_callbacks, indentation != npos);
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == '\n');

    _c4dbgfnl("found newline. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
    size_t ii = *i;
    size_t numnl_following = count_following_newlines(r, &ii, indentation);
    if(numnl_following)
    {
        _c4dbgfnl("{} consecutive (empty) lines {} in the middle. totalws={}", 1+numnl_following, ii < r.len ? "in the middle" : "at the end", ii - *i);
        for(size_t j = 0; j < numnl_following; ++j)
            m_filter_arena.str[(*pos)++] = '\n';
    }
    else
    {
        if(r.first_not_of(" \t", *i+1) != npos)
        {
            m_filter_arena.str[(*pos)++] = ' ';
            _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
            replaced = true;
        }
        else
        {
            if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            {
                m_filter_arena.str[(*pos)++] = ' ';
                _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
                replaced = true;
            }
            else
            {
                _c4dbgfnl("last newline, everything else is whitespace. ii={}/{}", ii, r.len);
                *i = r.len;
            }
        }
        if C4_IF_CONSTEXPR (backslash_is_escape)
        {
            if(ii < r.len && r.str[ii] == '\\')
            {
                const char next = ii+1 < r.len ? r.str[ii+1] : '\0';
                if(next == ' ' || next == '\t')
                {
                    _c4dbgfnl("extend skip to backslash{}", "");
                    ++ii;
                }
            }
        }
    }
    *i = ii - 1; // correct for the loop increment

    #undef _c4dbgfnl

    return replaced;
}